

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
ArrayToVectorState<true,_unsigned_int>::Uint
          (ArrayToVectorState<true,_unsigned_int> *this,Context<true> *param_2,uint f)

{
  BaseState<true> *in_RDI;
  value_type_conflict *in_stack_ffffffffffffffd8;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,in_stack_ffffffffffffffd8
            );
  return in_RDI;
}

Assistant:

BaseState<audit>* Uint(Context<audit>& /* ctx */, unsigned f)
  {
    output_array->push_back((T)f);
    return this;
  }